

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O2

AggregateFunctionSet * duckdb::AvgFun::GetFunctions(void)

{
  vector<duckdb::AggregateFunction,_true> *this;
  AggregateFunctionSet *in_RDI;
  FunctionNullHandling null_handling;
  initializer_list<duckdb::LogicalType> __l;
  undefined1 local_de8 [32];
  LogicalType local_dc8;
  LogicalType local_db0;
  LogicalType local_d98;
  LogicalType local_d80;
  LogicalType local_d68;
  LogicalType local_d50;
  LogicalType local_d38;
  AggregateFunction local_d20;
  AggregateFunction local_bf0;
  AggregateFunction local_ac0;
  AggregateFunction local_990;
  AggregateFunction local_860;
  AggregateFunction local_730;
  AggregateFunction local_600;
  AggregateFunction local_4d0;
  AggregateFunction local_3a0;
  AggregateFunction local_270;
  AggregateFunction local_140;
  
  AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  LogicalType::LogicalType(&local_d38,DECIMAL);
  __l._M_len = 1;
  __l._M_array = &local_d38;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_de8,__l,
             (allocator_type *)(local_de8 + 0x1f));
  LogicalType::LogicalType(&local_d50,DECIMAL);
  null_handling = DEFAULT_NULL_HANDLING;
  AggregateFunction::AggregateFunction
            (&local_140,(vector<duckdb::LogicalType,_true> *)local_de8,&local_d50,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,DEFAULT_NULL_HANDLING,
             (aggregate_simple_update_t)0x0,BindDecimalAvg,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  this = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_140);
  AggregateFunction::~AggregateFunction(&local_140);
  LogicalType::~LogicalType(&local_d50);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_de8);
  LogicalType::~LogicalType(&local_d38);
  GetAverageAggregate(&local_270,INT16);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_270);
  AggregateFunction::~AggregateFunction(&local_270);
  GetAverageAggregate(&local_3a0,INT32);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_3a0);
  AggregateFunction::~AggregateFunction(&local_3a0);
  GetAverageAggregate(&local_4d0,INT64);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_4d0);
  AggregateFunction::~AggregateFunction(&local_4d0);
  GetAverageAggregate(&local_600,INT128);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_600);
  AggregateFunction::~AggregateFunction(&local_600);
  GetAverageAggregate(&local_730,INTERVAL);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_730);
  AggregateFunction::~AggregateFunction(&local_730);
  LogicalType::LogicalType((LogicalType *)local_de8,DOUBLE);
  LogicalType::LogicalType(&local_d68,DOUBLE);
  AggregateFunction::
  UnaryAggregate<duckdb::AvgState<double>,double,double,duckdb::NumericAverageOperation,(duckdb::AggregateDestructorType)0>
            (&local_860,(AggregateFunction *)local_de8,&local_d68,(LogicalType *)0x0,null_handling);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_860);
  AggregateFunction::~AggregateFunction(&local_860);
  LogicalType::~LogicalType(&local_d68);
  LogicalType::~LogicalType((LogicalType *)local_de8);
  LogicalType::LogicalType((LogicalType *)local_de8,TIMESTAMP);
  LogicalType::LogicalType(&local_d80,TIMESTAMP);
  AggregateFunction::
  UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,long,long,duckdb::DiscreteAverageOperation,(duckdb::AggregateDestructorType)0>
            (&local_990,(AggregateFunction *)local_de8,&local_d80,(LogicalType *)0x0,null_handling);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_990);
  AggregateFunction::~AggregateFunction(&local_990);
  LogicalType::~LogicalType(&local_d80);
  LogicalType::~LogicalType((LogicalType *)local_de8);
  LogicalType::LogicalType((LogicalType *)local_de8,TIMESTAMP_TZ);
  LogicalType::LogicalType(&local_d98,TIMESTAMP_TZ);
  AggregateFunction::
  UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,long,long,duckdb::DiscreteAverageOperation,(duckdb::AggregateDestructorType)0>
            (&local_ac0,(AggregateFunction *)local_de8,&local_d98,(LogicalType *)0x0,null_handling);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_ac0);
  AggregateFunction::~AggregateFunction(&local_ac0);
  LogicalType::~LogicalType(&local_d98);
  LogicalType::~LogicalType((LogicalType *)local_de8);
  LogicalType::LogicalType((LogicalType *)local_de8,TIME);
  LogicalType::LogicalType(&local_db0,TIME);
  AggregateFunction::
  UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,long,long,duckdb::DiscreteAverageOperation,(duckdb::AggregateDestructorType)0>
            (&local_bf0,(AggregateFunction *)local_de8,&local_db0,(LogicalType *)0x0,null_handling);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_bf0);
  AggregateFunction::~AggregateFunction(&local_bf0);
  LogicalType::~LogicalType(&local_db0);
  LogicalType::~LogicalType((LogicalType *)local_de8);
  LogicalType::LogicalType((LogicalType *)local_de8,TIME_TZ);
  LogicalType::LogicalType(&local_dc8,TIME_TZ);
  AggregateFunction::
  UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::TimeTZAverageOperation,(duckdb::AggregateDestructorType)0>
            (&local_d20,(AggregateFunction *)local_de8,&local_dc8,(LogicalType *)0x0,null_handling);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&this->
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_d20);
  AggregateFunction::~AggregateFunction(&local_d20);
  LogicalType::~LogicalType(&local_dc8);
  LogicalType::~LogicalType((LogicalType *)local_de8);
  return in_RDI;
}

Assistant:

AggregateFunctionSet AvgFun::GetFunctions() {
	AggregateFunctionSet avg;

	avg.AddFunction(AggregateFunction({LogicalTypeId::DECIMAL}, LogicalTypeId::DECIMAL, nullptr, nullptr, nullptr,
	                                  nullptr, nullptr, FunctionNullHandling::DEFAULT_NULL_HANDLING, nullptr,
	                                  BindDecimalAvg));
	avg.AddFunction(GetAverageAggregate(PhysicalType::INT16));
	avg.AddFunction(GetAverageAggregate(PhysicalType::INT32));
	avg.AddFunction(GetAverageAggregate(PhysicalType::INT64));
	avg.AddFunction(GetAverageAggregate(PhysicalType::INT128));
	avg.AddFunction(GetAverageAggregate(PhysicalType::INTERVAL));
	avg.AddFunction(AggregateFunction::UnaryAggregate<AvgState<double>, double, double, NumericAverageOperation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE));

	avg.AddFunction(AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, int64_t, int64_t, DiscreteAverageOperation>(
	    LogicalType::TIMESTAMP, LogicalType::TIMESTAMP));
	avg.AddFunction(AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, int64_t, int64_t, DiscreteAverageOperation>(
	    LogicalType::TIMESTAMP_TZ, LogicalType::TIMESTAMP_TZ));
	avg.AddFunction(AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, int64_t, int64_t, DiscreteAverageOperation>(
	    LogicalType::TIME, LogicalType::TIME));
	avg.AddFunction(
	    AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, dtime_tz_t, dtime_tz_t, TimeTZAverageOperation>(
	        LogicalType::TIME_TZ, LogicalType::TIME_TZ));

	return avg;
}